

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf.cpp
# Opt level: O0

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd,RK_S32 ro,RK_U32 offset,RK_U32 length,char *caller)

{
  uint uVar1;
  int iVar2;
  MPP_RET MVar3;
  int *piVar4;
  char *pcVar5;
  long lStack_38;
  RK_S32 ret;
  dma_buf_sync_partial sync;
  char *caller_local;
  RK_U32 length_local;
  RK_U32 offset_local;
  RK_S32 ro_local;
  RK_S32 fd_local;
  
  sync._8_8_ = caller;
  if (has_partial_ops != 0) {
    if (length == 0) {
      return MPP_OK;
    }
    uVar1 = 3;
    if (ro != 0) {
      uVar1 = 1;
    }
    lStack_38 = (long)(int)(uVar1 | 4);
    sync.flags._0_4_ = offset & 0xffffffc0;
    sync.flags._4_4_ = ((length + offset) - (uint)sync.flags) + 0x3f & 0xffffffc0;
    iVar2 = ioctl(fd,0x40106202,&stack0xffffffffffffffc8);
    if (iVar2 == 0) {
      return MPP_OK;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0x19) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      _mpp_log_l(2,(char *)0x0,"ioctl failed for %s from %s\n","mpp_dmabuf_sync_partial_end",pcVar5,
                 sync._8_8_);
      return MPP_NOK;
    }
    has_partial_ops = 0;
  }
  MVar3 = mpp_dmabuf_sync_end(fd,ro,(char *)sync._8_8_);
  return MVar3;
}

Assistant:

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd, RK_S32 ro, RK_U32 offset, RK_U32 length, const char *caller)
{
    if (has_partial_ops) {
        struct dma_buf_sync_partial sync;
        RK_S32 ret;

        if (!length)
            return MPP_OK;

        sync.flags = DMA_BUF_SYNC_END | (ro ? DMA_BUF_SYNC_READ : DMA_BUF_SYNC_RW);
        sync.offset = MPP_ALIGN_DOWN(offset, CACHE_LINE_SIZE);
        sync.len = MPP_ALIGN(length + offset - sync.offset, CACHE_LINE_SIZE);

        ret = ioctl(fd, DMA_BUF_IOCTL_SYNC_PARTIAL, &sync);
        if (ret) {
            if (errno == MPP_NO_PARTIAL_SUPPORT) {
                has_partial_ops = 0;
                goto NOT_SUPPORT;
            }

            mpp_err_f("ioctl failed for %s from %s\n", strerror(errno), caller);
            return MPP_NOK;
        }

        return MPP_OK;
    }

NOT_SUPPORT:
    return mpp_dmabuf_sync_end(fd, ro, caller);
}